

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusinputcontextproxy.h
# Opt level: O3

QDBusPendingReply<> * __thiscall
QIBusInputContextProxy::Destroy
          (QDBusPendingReply<> *__return_storage_ptr__,QIBusInputContextProxy *this)

{
  long in_FS_OFFSET;
  undefined1 local_40 [16];
  qsizetype qStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  local_40._8_8_ = (char16_t *)0x0;
  qStack_30 = 0;
  QDBusAbstractInterface::asyncCallWithArgumentList((QString *)local_40,(QList *)this);
  QDBusPendingReplyBase::QDBusPendingReplyBase(&__return_storage_ptr__->super_QDBusPendingReplyBase)
  ;
  QDBusPendingReplyBase::assign((QDBusPendingCall *)__return_storage_ptr__);
  if (__return_storage_ptr__->super_QDBusPendingReplyBase != (QDBusPendingReplyBase)0x0) {
    QDBusPendingReplyBase::setMetaTypes((int)__return_storage_ptr__,(QMetaType *)0x0);
  }
  QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)local_40);
  QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)(local_40 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline QDBusPendingReply<> Destroy()
    {
        QList<QVariant> argumentList;
        return asyncCallWithArgumentList(QStringLiteral("Destroy"), argumentList);
    }